

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

void Cec3_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = fFirst == 0;
  for (; (((((ulong)pObj & 1) == 0 && (uVar1 = *(ulong *)pObj, (~(uint)uVar1 & 0x9fffffff) != 0)) &&
          ((!bVar2 || ((int)pObj->Value < 2)))) && ((fUseMuxes == 0 || ((uVar1 & 0x40000000) == 0)))
         ); pObj = (Gia_Obj_t *)
                   ((ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1) |
                   (ulong)(pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff)))) {
    Cec3_CollectSuper_rec
              ((Gia_Obj_t *)
               ((ulong)((uint)(uVar1 >> 0x1d) & 1) | (ulong)(pObj + -(uVar1 & 0x1fffffff))),vSuper,0
               ,fUseMuxes);
    bVar2 = true;
  }
  Vec_PtrPushUnique(vSuper,pObj);
  return;
}

Assistant:

void Cec3_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec3_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec3_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}